

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O1

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_0> *alhs,
          const_blas_data_mapper<double,_long,_1> *rhs,ResScalar *res,long resIncr,double alpha)

{
  ulong uVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  long j;
  long lVar18;
  double *pdVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  long lVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  
  lVar3 = (alhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_stride;
  uVar1 = lVar3 * 8;
  lVar16 = 4;
  if (uVar1 < 32000) {
    lVar16 = 0x10;
  }
  if (cols < 0x80) {
    lVar16 = cols;
  }
  if (0 < cols) {
    pdVar11 = (alhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar19 = pdVar11 + 0xe;
    lVar14 = lVar3 * lVar16;
    pdVar15 = pdVar11 + 4;
    lVar18 = 0;
    lVar12 = 0;
    do {
      lVar10 = lVar16 + lVar12;
      lVar13 = cols;
      if (lVar10 < cols) {
        lVar13 = lVar10;
      }
      if (rows < 0x10) {
        uVar17 = 0;
      }
      else {
        uVar17 = 0;
        pdVar24 = pdVar19;
        do {
          lVar26 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
          pdVar22 = (double *)
                    (lVar18 * lVar26 +
                    (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
          dVar41 = 0.0;
          dVar42 = 0.0;
          dVar39 = 0.0;
          dVar40 = 0.0;
          dVar37 = 0.0;
          dVar38 = 0.0;
          dVar35 = 0.0;
          dVar36 = 0.0;
          dVar33 = 0.0;
          dVar34 = 0.0;
          dVar31 = 0.0;
          dVar32 = 0.0;
          dVar29 = 0.0;
          dVar30 = 0.0;
          dVar27 = 0.0;
          dVar28 = 0.0;
          pdVar23 = pdVar24;
          lVar25 = lVar12;
          do {
            dVar2 = *pdVar22;
            dVar41 = dVar41 + pdVar23[-0xe] * dVar2;
            dVar42 = dVar42 + pdVar23[-0xd] * dVar2;
            dVar39 = dVar39 + pdVar23[-0xc] * dVar2;
            dVar40 = dVar40 + pdVar23[-0xb] * dVar2;
            dVar37 = dVar37 + pdVar23[-10] * dVar2;
            dVar38 = dVar38 + pdVar23[-9] * dVar2;
            dVar35 = dVar35 + pdVar23[-8] * dVar2;
            dVar36 = dVar36 + pdVar23[-7] * dVar2;
            dVar33 = dVar33 + pdVar23[-6] * dVar2;
            dVar34 = dVar34 + pdVar23[-5] * dVar2;
            dVar31 = dVar31 + pdVar23[-4] * dVar2;
            dVar32 = dVar32 + pdVar23[-3] * dVar2;
            dVar29 = dVar29 + pdVar23[-2] * dVar2;
            dVar30 = dVar30 + pdVar23[-1] * dVar2;
            dVar27 = dVar27 + *pdVar23 * dVar2;
            dVar28 = dVar28 + pdVar23[1] * dVar2;
            lVar25 = lVar25 + 1;
            pdVar22 = pdVar22 + lVar26;
            pdVar23 = pdVar23 + lVar3;
          } while (lVar25 < lVar13);
          dVar2 = (res + uVar17)[1];
          dVar4 = res[uVar17 + 2];
          dVar5 = (res + uVar17 + 2)[1];
          dVar6 = res[uVar17 + 4];
          dVar7 = (res + uVar17 + 4)[1];
          dVar8 = res[uVar17 + 6];
          dVar9 = (res + uVar17 + 6)[1];
          res[uVar17] = res[uVar17] + dVar41 * alpha;
          (res + uVar17)[1] = dVar2 + dVar42 * alpha;
          res[uVar17 + 2] = dVar39 * alpha + dVar4;
          (res + uVar17 + 2)[1] = dVar40 * alpha + dVar5;
          res[uVar17 + 4] = dVar37 * alpha + dVar6;
          (res + uVar17 + 4)[1] = dVar38 * alpha + dVar7;
          res[uVar17 + 6] = dVar35 * alpha + dVar8;
          (res + uVar17 + 6)[1] = dVar36 * alpha + dVar9;
          dVar35 = (res + uVar17 + 8)[1];
          res[uVar17 + 8] = dVar33 * alpha + res[uVar17 + 8];
          (res + uVar17 + 8)[1] = dVar34 * alpha + dVar35;
          dVar33 = (res + uVar17 + 10)[1];
          res[uVar17 + 10] = dVar31 * alpha + res[uVar17 + 10];
          (res + uVar17 + 10)[1] = dVar32 * alpha + dVar33;
          dVar31 = (res + uVar17 + 0xc)[1];
          res[uVar17 + 0xc] = dVar29 * alpha + res[uVar17 + 0xc];
          (res + uVar17 + 0xc)[1] = dVar30 * alpha + dVar31;
          dVar29 = (res + uVar17 + 0xe)[1];
          res[uVar17 + 0xe] = dVar27 * alpha + res[uVar17 + 0xe];
          (res + uVar17 + 0xe)[1] = dVar28 * alpha + dVar29;
          uVar17 = uVar17 + 0x10;
          pdVar24 = pdVar24 + 0x10;
        } while ((long)uVar17 < rows + -0xf);
      }
      if ((long)uVar17 < rows + -7) {
        lVar26 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar23 = (double *)
                  (lVar26 * lVar18 +
                  (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
        pdVar24 = pdVar15 + uVar17;
        dVar33 = 0.0;
        dVar34 = 0.0;
        dVar31 = 0.0;
        dVar32 = 0.0;
        dVar29 = 0.0;
        dVar30 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        lVar25 = lVar12;
        do {
          dVar35 = *pdVar23;
          dVar33 = dVar33 + pdVar24[-4] * dVar35;
          dVar34 = dVar34 + pdVar24[-3] * dVar35;
          dVar31 = dVar31 + pdVar24[-2] * dVar35;
          dVar32 = dVar32 + pdVar24[-1] * dVar35;
          dVar29 = dVar29 + *pdVar24 * dVar35;
          dVar30 = dVar30 + pdVar24[1] * dVar35;
          dVar27 = dVar27 + pdVar24[2] * dVar35;
          dVar28 = dVar28 + pdVar24[3] * dVar35;
          lVar25 = lVar25 + 1;
          pdVar23 = pdVar23 + lVar26;
          pdVar24 = pdVar24 + lVar3;
        } while (lVar25 < lVar13);
        dVar35 = (res + uVar17)[1];
        dVar36 = res[uVar17 + 2];
        dVar37 = (res + uVar17 + 2)[1];
        dVar38 = res[uVar17 + 4];
        dVar39 = (res + uVar17 + 4)[1];
        dVar40 = res[uVar17 + 6];
        dVar41 = (res + uVar17 + 6)[1];
        res[uVar17] = res[uVar17] + dVar33 * alpha;
        (res + uVar17)[1] = dVar35 + dVar34 * alpha;
        res[uVar17 + 2] = dVar31 * alpha + dVar36;
        (res + uVar17 + 2)[1] = dVar32 * alpha + dVar37;
        res[uVar17 + 4] = dVar29 * alpha + dVar38;
        (res + uVar17 + 4)[1] = dVar30 * alpha + dVar39;
        res[uVar17 + 6] = dVar27 * alpha + dVar40;
        (res + uVar17 + 6)[1] = dVar28 * alpha + dVar41;
        uVar17 = uVar17 | 8;
      }
      if ((long)uVar17 < rows + -5) {
        lVar25 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar24 = (double *)
                  (lVar25 * lVar18 +
                  (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
        lVar26 = uVar17 * 8;
        dVar31 = 0.0;
        dVar32 = 0.0;
        dVar29 = 0.0;
        dVar30 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        lVar20 = lVar12;
        do {
          dVar33 = *pdVar24;
          pdVar23 = (double *)((long)pdVar11 + lVar26 + 0x10);
          dVar31 = dVar31 + *(double *)((long)pdVar11 + lVar26) * dVar33;
          dVar32 = dVar32 + ((double *)((long)pdVar11 + lVar26))[1] * dVar33;
          dVar29 = dVar29 + *pdVar23 * dVar33;
          dVar30 = dVar30 + pdVar23[1] * dVar33;
          dVar27 = dVar27 + *(double *)((long)pdVar15 + lVar26) * dVar33;
          dVar28 = dVar28 + ((double *)((long)pdVar15 + lVar26))[1] * dVar33;
          lVar20 = lVar20 + 1;
          pdVar24 = pdVar24 + lVar25;
          lVar26 = lVar26 + uVar1;
        } while (lVar20 < lVar13);
        dVar33 = (res + uVar17)[1];
        dVar34 = res[uVar17 + 2];
        dVar35 = (res + uVar17 + 2)[1];
        dVar36 = res[uVar17 + 4];
        dVar37 = (res + uVar17 + 4)[1];
        res[uVar17] = res[uVar17] + dVar31 * alpha;
        (res + uVar17)[1] = dVar33 + dVar32 * alpha;
        res[uVar17 + 2] = dVar29 * alpha + dVar34;
        (res + uVar17 + 2)[1] = dVar30 * alpha + dVar35;
        res[uVar17 + 4] = dVar27 * alpha + dVar36;
        (res + uVar17 + 4)[1] = dVar28 * alpha + dVar37;
        uVar17 = uVar17 + 6;
      }
      if ((long)uVar17 < rows + -3) {
        lVar25 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar24 = (double *)
                  (lVar25 * lVar18 +
                  (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
        lVar26 = uVar17 * 8;
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar29 = 0.0;
        dVar30 = 0.0;
        lVar20 = lVar12;
        do {
          dVar31 = *pdVar24;
          pdVar23 = (double *)((long)pdVar11 + lVar26 + 0x10);
          dVar29 = dVar29 + *(double *)((long)pdVar11 + lVar26) * dVar31;
          dVar30 = dVar30 + ((double *)((long)pdVar11 + lVar26))[1] * dVar31;
          dVar27 = dVar27 + *pdVar23 * dVar31;
          dVar28 = dVar28 + pdVar23[1] * dVar31;
          lVar20 = lVar20 + 1;
          pdVar24 = pdVar24 + lVar25;
          lVar26 = lVar26 + uVar1;
        } while (lVar20 < lVar13);
        dVar31 = (res + uVar17)[1];
        dVar32 = res[uVar17 + 2];
        dVar33 = (res + uVar17 + 2)[1];
        res[uVar17] = res[uVar17] + dVar29 * alpha;
        (res + uVar17)[1] = dVar31 + dVar30 * alpha;
        res[uVar17 + 2] = dVar27 * alpha + dVar32;
        (res + uVar17 + 2)[1] = dVar28 * alpha + dVar33;
        uVar17 = uVar17 + 4;
      }
      if ((long)uVar17 < rows + -1) {
        lVar26 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar23 = (double *)
                  (lVar26 * lVar18 +
                  (long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data);
        pdVar24 = pdVar11 + uVar17;
        dVar27 = 0.0;
        dVar28 = 0.0;
        lVar25 = lVar12;
        do {
          dVar27 = dVar27 + *pdVar24 * *pdVar23;
          dVar28 = dVar28 + pdVar24[1] * *pdVar23;
          lVar25 = lVar25 + 1;
          pdVar23 = pdVar23 + lVar26;
          pdVar24 = pdVar24 + lVar3;
        } while (lVar25 < lVar13);
        dVar29 = (res + uVar17)[1];
        res[uVar17] = dVar27 * alpha + res[uVar17];
        (res + uVar17)[1] = dVar28 * alpha + dVar29;
        uVar17 = uVar17 + 2;
      }
      if ((long)uVar17 < rows) {
        lVar26 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
        pdVar23 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data;
        pdVar24 = pdVar11 + uVar17;
        do {
          dVar27 = 0.0;
          pdVar22 = (double *)(lVar26 * lVar18 + (long)pdVar23);
          lVar25 = lVar12;
          pdVar21 = pdVar24;
          do {
            dVar27 = dVar27 + *pdVar21 * *pdVar22;
            lVar25 = lVar25 + 1;
            pdVar22 = pdVar22 + lVar26;
            pdVar21 = pdVar21 + lVar3;
          } while (lVar25 < lVar13);
          res[uVar17] = dVar27 * alpha + res[uVar17];
          uVar17 = uVar17 + 1;
          pdVar24 = pdVar24 + 1;
        } while (uVar17 != rows);
      }
      lVar18 = lVar18 + lVar16 * 8;
      pdVar19 = pdVar19 + lVar14;
      pdVar15 = pdVar15 + lVar14;
      pdVar11 = pdVar11 + lVar14;
      lVar12 = lVar10;
    } while (lVar10 < cols);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
        ResScalar* res, Index resIncr,
  RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr);
  eigen_internal_assert(resIncr==1);

  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  const Index lhsStride = lhs.stride();
  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  const Index n8 = rows-8*ResPacketSize+1;
  const Index n4 = rows-4*ResPacketSize+1;
  const Index n3 = rows-3*ResPacketSize+1;
  const Index n2 = rows-2*ResPacketSize+1;
  const Index n1 = rows-1*ResPacketSize+1;
  const Index n_half = rows-1*ResPacketSizeHalf+1;
  const Index n_quarter = rows-1*ResPacketSizeQuarter+1;

  // TODO: improve the following heuristic:
  const Index block_cols = cols<128 ? cols : (lhsStride*sizeof(LhsScalar)<32000?16:4);
  ResPacket palpha = pset1<ResPacket>(alpha);
  ResPacketHalf palpha_half = pset1<ResPacketHalf>(alpha);
  ResPacketQuarter palpha_quarter = pset1<ResPacketQuarter>(alpha);

  for(Index j2=0; j2<cols; j2+=block_cols)
  {
    Index jend = numext::mini(j2+block_cols,cols);
    Index i=0;
    for(; i<n8; i+=ResPacketSize*8)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0)),
                c4 = pset1<ResPacket>(ResScalar(0)),
                c5 = pset1<ResPacket>(ResScalar(0)),
                c6 = pset1<ResPacket>(ResScalar(0)),
                c7 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
        c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*4,j),b0,c4);
        c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*5,j),b0,c5);
        c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*6,j),b0,c6);
        c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*7,j),b0,c7);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));
      pstoreu(res+i+ResPacketSize*4, pmadd(c4,palpha,ploadu<ResPacket>(res+i+ResPacketSize*4)));
      pstoreu(res+i+ResPacketSize*5, pmadd(c5,palpha,ploadu<ResPacket>(res+i+ResPacketSize*5)));
      pstoreu(res+i+ResPacketSize*6, pmadd(c6,palpha,ploadu<ResPacket>(res+i+ResPacketSize*6)));
      pstoreu(res+i+ResPacketSize*7, pmadd(c7,palpha,ploadu<ResPacket>(res+i+ResPacketSize*7)));
    }
    if(i<n4)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));

      i+=ResPacketSize*4;
    }
    if(i<n3)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));

      i+=ResPacketSize*3;
    }
    if(i<n2)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      i+=ResPacketSize*2;
    }
    if(i<n1)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      i+=ResPacketSize;
    }
    if(HasHalf && i<n_half)
    {
      ResPacketHalf c0 = pset1<ResPacketHalf>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketHalf b0 = pset1<RhsPacketHalf>(rhs(j,0));
        c0 = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeHalf*0, pmadd(c0,palpha_half,ploadu<ResPacketHalf>(res+i+ResPacketSizeHalf*0)));
      i+=ResPacketSizeHalf;
    }
    if(HasQuarter && i<n_quarter)
    {
      ResPacketQuarter c0 = pset1<ResPacketQuarter>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketQuarter b0 = pset1<RhsPacketQuarter>(rhs(j,0));
        c0 = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeQuarter*0, pmadd(c0,palpha_quarter,ploadu<ResPacketQuarter>(res+i+ResPacketSizeQuarter*0)));
      i+=ResPacketSizeQuarter;
    }
    for(;i<rows;++i)
    {
      ResScalar c0(0);
      for(Index j=j2; j<jend; j+=1)
        c0 += cj.pmul(lhs(i,j), rhs(j,0));
      res[i] += alpha*c0;
    }
  }
}